

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O1

void EmitObjectInitializers
               (ParseNode *memberList,RegSlot objectLocation,ByteCodeGenerator *byteCodeGenerator,
               FuncInfo *funcInfo)

{
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar1;
  ParseNode *this;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  BOOL BVar5;
  uint uVar6;
  uint C1;
  BaseDictionary<int,_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *this_00;
  ParseNodeBin *pPVar7;
  ParseNodeStr *pPVar8;
  undefined4 *puVar9;
  PropertyIdArray *obj;
  FunctionBody *this_01;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  ParseNodePtr pPVar13;
  bool *in_stack_ffffffffffffff88;
  uint32 local_40;
  Type local_3c;
  uint32 value;
  Type local_34 [2];
  PropertyId propertyId;
  
  bVar4 = false;
  value = objectLocation;
  this_00 = (BaseDictionary<int,_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
             *)new<Memory::ArenaAllocator>(0x38,byteCodeGenerator->alloc,0x366bee);
  JsUtil::
  BaseDictionary<int,_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(this_00,byteCodeGenerator->alloc,0x11);
  if (memberList != (ParseNode *)0x0) {
    pPVar13 = memberList;
    if (memberList->nop == knopList) {
      do {
        pPVar7 = ParseNode::AsParseNodeBin(pPVar13);
        bVar4 = true;
        if (pPVar7->pnode1->nop == knopEllipsis) goto LAB_0081f6b9;
        pPVar7 = ParseNode::AsParseNodeBin(pPVar13);
        pPVar7 = ParseNode::AsParseNodeBin(pPVar7->pnode1);
        if (pPVar7->pnode1->nop == knopComputedName) goto LAB_0081f6b9;
        pPVar7 = ParseNode::AsParseNodeBin(pPVar13);
        pPVar7 = ParseNode::AsParseNodeBin(pPVar7->pnode1);
        pPVar8 = ParseNode::AsParseNodeStr(pPVar7->pnode1);
        local_34[0] = pPVar8->pid->m_propertyId;
        BVar5 = Js::ScriptContext::IsNumericPropertyId
                          (byteCodeGenerator->scriptContext,local_34[0],&local_40);
        if (BVar5 == 0) {
          local_3c = local_34[0];
          JsUtil::
          BaseDictionary<int,int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
          ::
          Insert<(JsUtil::BaseDictionary<int,int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>::InsertOperations)2>
                    ((BaseDictionary<int,int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
                      *)this_00,(int *)&local_3c,(int *)local_34);
        }
        pPVar7 = ParseNode::AsParseNodeBin(pPVar13);
        pPVar13 = pPVar7->pnode2;
      } while (pPVar13->nop == knopList);
      bVar4 = false;
    }
    else {
      bVar4 = false;
    }
LAB_0081f6b9:
    if (((pPVar13->nop != knopEllipsis) &&
        (pPVar7 = ParseNode::AsParseNodeBin(pPVar13), pPVar7->pnode1->nop != knopComputedName)) &&
       (!bVar4)) {
      pPVar7 = ParseNode::AsParseNodeBin(pPVar13);
      pPVar8 = ParseNode::AsParseNodeStr(pPVar7->pnode1);
      local_34[0] = pPVar8->pid->m_propertyId;
      BVar5 = Js::ScriptContext::IsNumericPropertyId
                        (byteCodeGenerator->scriptContext,local_34[0],&local_40);
      if (BVar5 == 0) {
        local_3c = local_34[0];
        JsUtil::
        BaseDictionary<int,int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
        ::
        Insert<(JsUtil::BaseDictionary<int,int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>::InsertOperations)2>
                  ((BaseDictionary<int,int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
                    *)this_00,(int *)&local_3c,(int *)local_34);
      }
    }
  }
  if (memberList != (ParseNode *)0x0) {
    if (this_00->count != this_00->freeCount) {
      uVar10 = this_00->count - this_00->freeCount;
      if (0x3fffffff < uVar10) {
LAB_0081fb18:
        Math::DefaultOverflowPolicy();
      }
      pAVar1 = &byteCodeGenerator->alloc->
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
      BVar5 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar5 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x207,"(ExceptionCheck::CanHandleOutOfMemory())",
                           "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar3) goto LAB_0081fb1d;
        *puVar9 = 0;
      }
      uVar6 = uVar10 * 4;
      obj = (PropertyIdArray *)
            Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
            AllocInternal(pAVar1,(ulong)uVar6 + 8);
      if (obj == (PropertyIdArray *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x20d,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar3) {
LAB_0081fb1d:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar9 = 0;
      }
      obj->count = uVar10;
      obj->extraSlots = '\0';
      obj->hadDuplicates = false;
      obj->has__proto__ = false;
      obj->hasNonSimpleParams = false;
      local_3c = 0x1eb;
      bVar3 = JsUtil::
              BaseDictionary<int,_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
              ::ContainsKey(this_00,(int *)&local_3c);
      if (bVar3) {
        obj->has__proto__ = true;
      }
      uVar12 = 0;
      pPVar13 = memberList;
      if (memberList->nop == knopList) {
        do {
          uVar11 = (uint)uVar12;
          pPVar7 = ParseNode::AsParseNodeBin(pPVar13);
          if (pPVar7->pnode1->nop == knopEllipsis) break;
          pPVar7 = ParseNode::AsParseNodeBin(pPVar13);
          pPVar7 = ParseNode::AsParseNodeBin(pPVar7->pnode1);
          if (pPVar7->pnode1->nop == knopComputedName) break;
          pPVar7 = ParseNode::AsParseNodeBin(pPVar13);
          pPVar7 = ParseNode::AsParseNodeBin(pPVar7->pnode1);
          pPVar8 = ParseNode::AsParseNodeStr(pPVar7->pnode1);
          local_34[0] = pPVar8->pid->m_propertyId;
          BVar5 = Js::ScriptContext::IsNumericPropertyId
                            (byteCodeGenerator->scriptContext,local_34[0],&local_40);
          if (BVar5 == 0) {
            local_3c = local_34[0];
            bVar3 = JsUtil::
                    BaseDictionary<int,_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                    ::Remove(this_00,(int *)&local_3c);
            if (bVar3) {
              (&obj[1].count)[uVar12] = local_34[0];
              uVar12 = (ulong)(uVar11 + 1);
            }
          }
          uVar11 = (uint)uVar12;
          pPVar7 = ParseNode::AsParseNodeBin(pPVar13);
          pPVar13 = pPVar7->pnode2;
        } while (pPVar13->nop == knopList);
        uVar12 = (ulong)uVar11;
      }
      if (((pPVar13->nop != knopEllipsis) &&
          (pPVar7 = ParseNode::AsParseNodeBin(pPVar13), pPVar7->pnode1->nop != knopComputedName)) &&
         (!bVar4)) {
        pPVar7 = ParseNode::AsParseNodeBin(pPVar13);
        pPVar8 = ParseNode::AsParseNodeStr(pPVar7->pnode1);
        local_34[0] = pPVar8->pid->m_propertyId;
        BVar5 = Js::ScriptContext::IsNumericPropertyId
                          (byteCodeGenerator->scriptContext,local_34[0],&local_40);
        if (BVar5 == 0) {
          local_3c = local_34[0];
          bVar4 = JsUtil::
                  BaseDictionary<int,_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                  ::Remove(this_00,(int *)&local_3c);
          if (bVar4) {
            (&obj[1].count)[uVar12] = local_34[0];
          }
        }
      }
      this_01 = FuncInfo::GetParsedFunctionBody(funcInfo);
      C1 = Js::FunctionBody::NewObjectLiteral(this_01);
      if (0x3ffffffd < uVar10) goto LAB_0081fb18;
      Js::ByteCodeWriter::Auxiliary
                (&byteCodeGenerator->m_writer,NewScObjectLiteral,value,obj,uVar6 + 8,C1);
      pAVar1 = &byteCodeGenerator->alloc->
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
      JsUtil::
      BaseDictionary<int,_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
      ::~BaseDictionary(this_00);
      Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                (pAVar1,this_00,0x38);
      Memory::
      DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,Js::PropertyIdArray>
                (byteCodeGenerator->alloc,obj,(ulong)uVar6);
      goto LAB_0081fa01;
    }
  }
  Js::ByteCodeWriter::Reg1(&byteCodeGenerator->m_writer,NewScObjectSimple,value);
LAB_0081fa01:
  if (memberList != (ParseNode *)0x0) {
    if (memberList->nop == knopList) {
      bVar4 = false;
      do {
        pPVar7 = ParseNode::AsParseNodeBin(memberList);
        this = pPVar7->pnode1;
        if (this->nop == knopEllipsis) {
          ByteCodeGenerator::StartSubexpression(byteCodeGenerator,this);
          EmitObjectSpreadNode(this,value,byteCodeGenerator,funcInfo);
        }
        else {
          pPVar7 = ParseNode::AsParseNodeBin(this);
          if (pPVar7->pnode1->nop == knopComputedName) {
            bVar4 = true;
          }
          ByteCodeGenerator::StartSubexpression(byteCodeGenerator,this);
          EmitMemberNode(this,value,byteCodeGenerator,funcInfo,(ParseNode *)0x0,bVar4,
                         in_stack_ffffffffffffff88);
        }
        Js::ByteCodeWriter::EndSubexpression(&byteCodeGenerator->m_writer,this);
        pPVar7 = ParseNode::AsParseNodeBin(memberList);
        memberList = pPVar7->pnode2;
      } while (memberList->nop == knopList);
    }
    else {
      bVar4 = false;
    }
    ByteCodeGenerator::StartSubexpression(byteCodeGenerator,memberList);
    if (memberList->nop == knopEllipsis) {
      EmitObjectSpreadNode(memberList,value,byteCodeGenerator,funcInfo);
    }
    else {
      EmitMemberNode(memberList,value,byteCodeGenerator,funcInfo,(ParseNode *)0x0,bVar4,
                     in_stack_ffffffffffffff88);
    }
    Js::ByteCodeWriter::EndSubexpression(&byteCodeGenerator->m_writer,memberList);
  }
  return;
}

Assistant:

void EmitObjectInitializers(ParseNode *memberList, Js::RegSlot objectLocation, ByteCodeGenerator *byteCodeGenerator, FuncInfo *funcInfo)
{
    ParseNode *pmemberList = memberList;
    unsigned int argCount = 0;
    uint32  value;
    Js::PropertyId propertyId;

    //
    // 1. Add all non-int property ids to a dictionary propertyIds with value true
    // 2. Get the count of propertyIds
    // 3. Create a propertyId array of size count
    // 4. Put the propIds in the auxiliary area
    // 5. Get the objectLiteralCacheId
    // 6. Generate propId inits with values
    //

    // Handle propertyId collision
    typedef JsUtil::BaseHashSet<Js::PropertyId, ArenaAllocator, PowerOf2SizePolicy> PropertyIdSet;
    PropertyIdSet* propertyIds = Anew(byteCodeGenerator->GetAllocator(), PropertyIdSet, byteCodeGenerator->GetAllocator(), 17);

    bool hasComputedNameOrSpread = false;
    if (memberList != nullptr)
    {
        while (memberList->nop == knopList)
        {
            if (memberList->AsParseNodeBin()->pnode1->nop == knopEllipsis || memberList->AsParseNodeBin()->pnode1->AsParseNodeBin()->pnode1->nop == knopComputedName)
            {
                hasComputedNameOrSpread = true;
                break;
            }

            propertyId = memberList->AsParseNodeBin()->pnode1->AsParseNodeBin()->pnode1->AsParseNodeStr()->pid->GetPropertyId();
            if (!byteCodeGenerator->GetScriptContext()->IsNumericPropertyId(propertyId, &value))
            {
                propertyIds->Item(propertyId);
            }

            memberList = memberList->AsParseNodeBin()->pnode2;
        }

        if (memberList->nop != knopEllipsis && memberList->AsParseNodeBin()->pnode1->nop != knopComputedName && !hasComputedNameOrSpread)
        {
            propertyId = memberList->AsParseNodeBin()->pnode1->AsParseNodeStr()->pid->GetPropertyId();
            if (!byteCodeGenerator->GetScriptContext()->IsNumericPropertyId(propertyId, &value))
            {
                propertyIds->Item(propertyId);
            }
        }
    }

    argCount = propertyIds->Count();

    memberList = pmemberList;
    if ((memberList == nullptr) || (argCount == 0))
    {
        // Empty literal or numeric property only object literal
        byteCodeGenerator->Writer()->Reg1(Js::OpCode::NewScObjectSimple, objectLocation);
    }
    else
    {
        uint32 allocSize = UInt32Math::Mul(argCount, sizeof(Js::PropertyId));
        Js::PropertyIdArray *propIds = AnewPlus(byteCodeGenerator->GetAllocator(), allocSize, Js::PropertyIdArray, argCount, 0);

        if (propertyIds->ContainsKey(Js::PropertyIds::__proto__))
        {
            // Always record whether the initializer contains __proto__ no matter if current environment has it enabled
            // or not, in case the bytecode is later run with __proto__ enabled.
            propIds->has__proto__ = true;
        }

        unsigned int argIndex = 0;
        while (memberList->nop == knopList)
        {
            if (memberList->AsParseNodeBin()->pnode1->nop == knopEllipsis || memberList->AsParseNodeBin()->pnode1->AsParseNodeBin()->pnode1->nop == knopComputedName)
            {
                break;
            }
            propertyId = memberList->AsParseNodeBin()->pnode1->AsParseNodeBin()->pnode1->AsParseNodeStr()->pid->GetPropertyId();
            if (!byteCodeGenerator->GetScriptContext()->IsNumericPropertyId(propertyId, &value) && propertyIds->Remove(propertyId))
            {
                propIds->elements[argIndex] = propertyId;
                argIndex++;
            }
            memberList = memberList->AsParseNodeBin()->pnode2;
        }

        if (memberList->nop != knopEllipsis && memberList->AsParseNodeBin()->pnode1->nop != knopComputedName && !hasComputedNameOrSpread)
        {
            propertyId = memberList->AsParseNodeBin()->pnode1->AsParseNodeStr()->pid->GetPropertyId();
            if (!byteCodeGenerator->GetScriptContext()->IsNumericPropertyId(propertyId, &value) && propertyIds->Remove(propertyId))
            {
                propIds->elements[argIndex] = propertyId;
                argIndex++;
            }
        }

        uint32 literalObjectId = funcInfo->GetParsedFunctionBody()->NewObjectLiteral();

        // Generate the opcode with propIds and cacheId
        byteCodeGenerator->Writer()->Auxiliary(Js::OpCode::NewScObjectLiteral, objectLocation, propIds, UInt32Math::Add(sizeof(Js::PropertyIdArray), allocSize), literalObjectId);

        Adelete(byteCodeGenerator->GetAllocator(), propertyIds);

        AdeletePlus(byteCodeGenerator->GetAllocator(), allocSize, propIds);
    }

    memberList = pmemberList;

    bool useStore = false;
    // Generate the actual assignment to those properties
    if (memberList != nullptr)
    {
        while (memberList->nop == knopList)
        {
            ParseNode *memberNode = memberList->AsParseNodeBin()->pnode1;
            if (memberNode->nop == knopEllipsis) 
            {
                byteCodeGenerator->StartSubexpression(memberNode);
                EmitObjectSpreadNode(memberNode, objectLocation, byteCodeGenerator, funcInfo);
                byteCodeGenerator->EndSubexpression(memberNode);
            }
            else
            {
                if (memberNode->AsParseNodeBin()->pnode1->nop == knopComputedName)
                {
                    useStore = true;
                }

                byteCodeGenerator->StartSubexpression(memberNode);
                EmitMemberNode(memberNode, objectLocation, byteCodeGenerator, funcInfo, nullptr, useStore);
                byteCodeGenerator->EndSubexpression(memberNode);
            }
            memberList = memberList->AsParseNodeBin()->pnode2;
        }

        byteCodeGenerator->StartSubexpression(memberList);
        if (memberList->nop == knopEllipsis)
        {
            EmitObjectSpreadNode(memberList, objectLocation, byteCodeGenerator, funcInfo);
        }
        else
        {
            EmitMemberNode(memberList, objectLocation, byteCodeGenerator, funcInfo, nullptr, useStore);
        }
        byteCodeGenerator->EndSubexpression(memberList);
    }
}